

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::xpath_node_set::_assign(xpath_node_set *this,const_iterator begin_,const_iterator end_)

{
  xml_attribute_struct *pxVar1;
  xpath_node *__dest;
  undefined8 *puVar2;
  ulong __n;
  
  if (end_ < begin_) {
    __assert_fail("begin_ <= end_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/pugixml.cpp"
                  ,0x27ed,"void pugi::xpath_node_set::_assign(const_iterator, const_iterator)");
  }
  __n = (long)end_ - (long)begin_;
  if (__n < 0x11) {
    __dest = &this->_storage;
    if (this->_begin != __dest) {
      (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
      )();
    }
    if (begin_ != end_) {
      pxVar1 = (begin_->_attribute)._attr;
      (__dest->_node)._root = (begin_->_node)._root;
      (this->_storage)._attribute._attr = pxVar1;
    }
  }
  else {
    __dest = (xpath_node *)
             (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                       allocate)(__n);
    if (__dest == (xpath_node *)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = getsockname;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    memcpy(__dest,begin_,__n);
    if (this->_begin != &this->_storage) {
      (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
      )();
    }
  }
  this->_begin = __dest;
  this->_end = (xpath_node *)((long)__dest + __n);
  return;
}

Assistant:

PUGI__FN void xpath_node_set::_assign(const_iterator begin_, const_iterator end_)
	{
		assert(begin_ <= end_);

		size_t size_ = static_cast<size_t>(end_ - begin_);

		if (size_ <= 1)
		{
			// deallocate old buffer
			if (_begin != &_storage) impl::xml_memory::deallocate(_begin);

			// use internal buffer
			if (begin_ != end_) _storage = *begin_;

			_begin = &_storage;
			_end = &_storage + size_;
		}
		else
		{
			// make heap copy
			xpath_node* storage = static_cast<xpath_node*>(impl::xml_memory::allocate(size_ * sizeof(xpath_node)));

			if (!storage)
			{
			#ifdef PUGIXML_NO_EXCEPTIONS
				return;
			#else
				throw std::bad_alloc();
			#endif
			}

			memcpy(storage, begin_, size_ * sizeof(xpath_node));
			
			// deallocate old buffer
			if (_begin != &_storage) impl::xml_memory::deallocate(_begin);

			// finalize
			_begin = storage;
			_end = storage + size_;
		}
	}